

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O3

void __thiscall
solitaire::graphics::SDLGraphicsSystem::initializeSDLOrQuitAndThrowError(SDLGraphicsSystem *this)

{
  Wrapper *pWVar1;
  int iVar2;
  undefined8 extraout_RAX;
  string local_38;
  
  pWVar1 = (this->sdl)._M_t.
           super___uniq_ptr_impl<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::SDL::interfaces::Wrapper_*,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
           .super__Head_base<0UL,_solitaire::SDL::interfaces::Wrapper_*,_false>._M_head_impl;
  iVar2 = (*pWVar1->_vptr_Wrapper[2])(pWVar1,0x20);
  if (iVar2 == 0) {
    this->isSDLInitialized = true;
    return;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Cannot initialize graphics system","");
  quitAndThrow(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void SDLGraphicsSystem::initializeSDLOrQuitAndThrowError() {
    if (sdl->init(SDL_INIT_VIDEO))
        quitAndThrow("Cannot initialize graphics system");

    isSDLInitialized = true;
}